

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::RemoveDefineFlag(cmMakefile *this,char *flag)

{
  bool bVar1;
  size_t len;
  cmMakefile *this_00;
  allocator local_49;
  undefined1 local_48 [32];
  
  this_00 = (cmMakefile *)flag;
  len = strlen(flag);
  if (len != 0) {
    RemoveDefineFlag(this_00,flag,len,&this->DefineFlagsOrig);
    std::__cxx11::string::string((string *)local_48,flag,&local_49);
    bVar1 = ParseDefineFlag(this,(string *)local_48,true);
    if ((cmMakefile *)local_48._0_8_ != (cmMakefile *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
    if (!bVar1) {
      RemoveDefineFlag((cmMakefile *)local_48._0_8_,flag,len,&this->DefineFlags);
    }
  }
  return;
}

Assistant:

void cmMakefile::RemoveDefineFlag(const char* flag)
{
  // Check the length of the flag to remove.
  std::string::size_type len = strlen(flag);
  if(len < 1)
    {
    return;
    }

  // Update the string used for the old DEFINITIONS property.
  this->RemoveDefineFlag(flag, len, this->DefineFlagsOrig);

  // If this is really a definition, update COMPILE_DEFINITIONS.
  if(this->ParseDefineFlag(flag, true))
    {
    return;
    }

  // Remove this flag that does not look like a definition.
  this->RemoveDefineFlag(flag, len, this->DefineFlags);
}